

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_parse_directives(JSParseState *s)

{
  int iVar1;
  BOOL BVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  JSFunctionDef *pJVar6;
  byte bVar7;
  char str [20];
  undefined3 local_58;
  undefined5 uStack_55;
  short local_50;
  undefined1 uStack_4e;
  uint8_t *local_38;
  
  if ((s->token).val != -0x7f) {
    return 0;
  }
  iVar5 = s->last_line_num;
  iVar1 = (s->token).line_num;
  local_38 = (s->token).ptr;
  BVar2 = s->got_lf;
  do {
    puVar3 = (s->token).ptr;
    snprintf((char *)&local_58,0x14,"%.*s",(ulong)((*(int *)&s->buf_ptr - (int)puVar3) - 2),
             puVar3 + 1);
    iVar4 = next_token(s);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = (s->token).val;
    switch(iVar4) {
    case -0x80:
    case -0x7f:
    case -0x7e:
    case -0x7d:
    case -0x7c:
    case -0x6c:
    case -0x6b:
    case -0x55:
    case -0x54:
    case -0x53:
    case -0x52:
    case -0x50:
    case -0x4f:
    case -0x4e:
    case -0x4d:
    case -0x4b:
    case -0x4a:
    case -0x47:
    case -0x46:
    case -0x45:
    case -0x42:
    case -0x3f:
    case -0x3e:
    case -0x3b:
    case -0x3a:
    case -0x39:
    case -0x38:
    case -0x37:
    case -0x36:
    case -0x35:
    case -0x33:
    case -0x32:
    case -0x30:
    case -0x2f:
    case -0x2e:
    case -0x2d:
    case -0x2c:
    case -0x2b:
    case -0x2a:
      if (s->got_lf == 0) goto switchD_00150fc6_caseD_ffffff85;
      break;
    case -0x7b:
    case -0x7a:
    case -0x79:
    case -0x78:
    case -0x77:
    case -0x76:
    case -0x75:
    case -0x74:
    case -0x73:
    case -0x72:
    case -0x71:
    case -0x70:
    case -0x6f:
    case -0x6e:
    case -0x6d:
    case -0x6a:
    case -0x69:
    case -0x68:
    case -0x67:
    case -0x66:
    case -0x65:
    case -100:
    case -99:
    case -0x62:
    case -0x61:
    case -0x60:
    case -0x5f:
    case -0x5e:
    case -0x5d:
    case -0x5c:
    case -0x5b:
    case -0x5a:
    case -0x59:
    case -0x58:
    case -0x57:
    case -0x51:
    case -0x4c:
    case -0x49:
    case -0x48:
    case -0x44:
    case -0x43:
    case -0x41:
    case -0x40:
    case -0x3d:
    case -0x3c:
    case -0x34:
    case -0x31:
      goto switchD_00150fc6_caseD_ffffff85;
    case -0x56:
      break;
    default:
      if (iVar4 != 0x7d) {
        if (iVar4 != 0x3b) goto switchD_00150fc6_caseD_ffffff85;
        iVar4 = next_token(s);
        if (iVar4 != 0) {
          return -1;
        }
      }
    }
    if (CONCAT17(uStack_4e,CONCAT25(local_50,uStack_55)) == 0x74636972747320 &&
        CONCAT53(uStack_55,local_58) == 0x6972747320657375) {
      pJVar6 = s->cur_func;
      pJVar6->has_use_strict = 1;
      bVar7 = 1;
LAB_0015101c:
      pJVar6->js_mode = pJVar6->js_mode | bVar7;
    }
    else if (local_50 == 0x70 && CONCAT53(uStack_55,local_58) == 0x6972747320657375) {
      pJVar6 = s->cur_func;
      bVar7 = 2;
      goto LAB_0015101c;
    }
  } while ((s->token).val == -0x7f);
switchD_00150fc6_caseD_ffffff85:
  (s->token).line_num = iVar5;
  s->line_num = iVar1;
  s->buf_ptr = local_38;
  s->got_lf = BVar2;
  iVar5 = next_token(s);
  return iVar5;
}

Assistant:

static __exception int js_parse_directives(JSParseState *s)
{
    char str[20];
    JSParsePos pos;
    BOOL has_semi;

    if (s->token.val != TOK_STRING)
        return 0;

    js_parse_get_pos(s, &pos);

    while(s->token.val == TOK_STRING) {
        /* Copy actual source string representation */
        snprintf(str, sizeof str, "%.*s",
                 (int)(s->buf_ptr - s->token.ptr - 2), s->token.ptr + 1);

        if (next_token(s))
            return -1;

        has_semi = FALSE;
        switch (s->token.val) {
        case ';':
            if (next_token(s))
                return -1;
            has_semi = TRUE;
            break;
        case '}':
        case TOK_EOF:
            has_semi = TRUE;
            break;
        case TOK_NUMBER:
        case TOK_STRING:
        case TOK_TEMPLATE:
        case TOK_IDENT:
        case TOK_REGEXP:
        case TOK_DEC:
        case TOK_INC:
        case TOK_NULL:
        case TOK_FALSE:
        case TOK_TRUE:
        case TOK_IF:
        case TOK_RETURN:
        case TOK_VAR:
        case TOK_THIS:
        case TOK_DELETE:
        case TOK_TYPEOF:
        case TOK_NEW:
        case TOK_DO:
        case TOK_WHILE:
        case TOK_FOR:
        case TOK_SWITCH:
        case TOK_THROW:
        case TOK_TRY:
        case TOK_FUNCTION:
        case TOK_DEBUGGER:
        case TOK_WITH:
        case TOK_CLASS:
        case TOK_CONST:
        case TOK_ENUM:
        case TOK_EXPORT:
        case TOK_IMPORT:
        case TOK_SUPER:
        case TOK_INTERFACE:
        case TOK_LET:
        case TOK_PACKAGE:
        case TOK_PRIVATE:
        case TOK_PROTECTED:
        case TOK_PUBLIC:
        case TOK_STATIC:
            /* automatic insertion of ';' */
            if (s->got_lf)
                has_semi = TRUE;
            break;
        default:
            break;
        }
        if (!has_semi)
            break;
        if (!strcmp(str, "use strict")) {
            s->cur_func->has_use_strict = TRUE;
            s->cur_func->js_mode |= JS_MODE_STRICT;
        }
#if !defined(DUMP_BYTECODE) || !(DUMP_BYTECODE & 8)
        else if (!strcmp(str, "use strip")) {
            s->cur_func->js_mode |= JS_MODE_STRIP;
        }
#endif
#ifdef CONFIG_BIGNUM
        else if (s->ctx->bignum_ext && !strcmp(str, "use math")) {
            s->cur_func->js_mode |= JS_MODE_MATH;
        }
#endif
    }
    return js_parse_seek_token(s, &pos);
}